

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Color.cpp
# Opt level: O2

void __thiscall
Color::Color(Color *this,color_id fg,color_id bg,bool underline,bool bold,bool bright)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = bg << 8 | 0x10000000;
  if (bg == nocolor) {
    uVar1 = 0;
  }
  uVar2 = (ulong)(fg | 0x8000000);
  if (fg == nocolor) {
    uVar2 = 0;
  }
  this->_value = uVar2 | ((uint)bright << 0x18 | (uint)bold << 0x19 | (uint)underline << 0x1a) |
                 (long)(int)uVar1;
  return;
}

Assistant:

Color::Color (color_id fg, color_id bg, bool underline, bool bold, bool bright)
: _value (0)
{
  _value |= ((underline ? _COLOR_UNDERLINE : 0))
         |  ((bold      ? _COLOR_BOLD : 0))
         |  ((bright    ? _COLOR_BRIGHT : 0));

  if (bg != Color::nocolor)
  {
    _value |= _COLOR_HASBG;
    _value |= (bg << 8);
  }

  if (fg != Color::nocolor)
  {
    _value |= _COLOR_HASFG;
    _value |= fg;
  }
}